

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O1

TPZAutoPointer<TPZMatrix<std::complex<double>_>_> __thiscall
TPZSTShiftAndInvert<std::complex<double>_>::CalcMatrix
          (TPZSTShiftAndInvert<std::complex<double>_> *this,
          TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *A,
          TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *B)

{
  atomic_int *paVar1;
  TPZSpectralTransform<std::complex<double>_> TVar2;
  int iVar3;
  undefined8 *in_RCX;
  undefined8 *puVar4;
  undefined8 extraout_RDX;
  complex<double> value;
  TPZFMatrixRef<std::complex<double>_> local_1e8;
  TPZFMatrixRef<std::complex<double>_> local_150;
  TPZFMatrix<std::complex<double>_> local_b8;
  
  TVar2 = (TPZSpectralTransform<std::complex<double>_>)B->fRef;
  (this->super_TPZSTShiftOrigin<std::complex<double>_>).
  super_TPZSpectralTransform<std::complex<double>_> = TVar2;
  LOCK();
  paVar1 = (atomic_int *)((long)TVar2 + 8);
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  puVar4 = in_RCX;
  TPZMatrix<std::complex<double>_>::Storage
            (&local_1e8,
             *(TPZMatrix<std::complex<double>_> **)
              (this->super_TPZSTShiftOrigin<std::complex<double>_>).
              super_TPZSpectralTransform<std::complex<double>_>);
  TPZMatrix<std::complex<double>_>::Storage
            (&local_150,*(TPZMatrix<std::complex<double>_> **)*in_RCX);
  TPZFMatrixRef<std::complex<double>_>::~TPZFMatrixRef
            (&local_150,&TPZFMatrixRef<std::complex<double>>::VTT);
  TPZFMatrixRef<std::complex<double>_>::~TPZFMatrixRef
            (&local_1e8,&TPZFMatrixRef<std::complex<double>>::VTT);
  if (local_1e8.super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
      super_TPZBaseMatrix.fRow !=
      local_150.super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
      super_TPZBaseMatrix.fRow) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual TPZAutoPointer<TPZMatrix<TVar>> TPZSTShiftAndInvert<std::complex<double>>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>, TPZAutoPointer<TPZMatrix<TVar>>) const [TVar = std::complex<double>]"
               ,0xc3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "\nERROR: Matrices have uncompatible storage formats.\nAborting...\n",0x40);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Solvers/EigenSolvers/TPZSpectralTransform.cpp"
               ,0x51);
  }
  TPZMatrix<std::complex<double>_>::Storage
            (&local_1e8,*(TPZMatrix<std::complex<double>_> **)*in_RCX);
  value._M_value._8_8_ = puVar4;
  value._M_value._0_8_ = extraout_RDX;
  TPZFMatrix<std::complex<double>_>::operator*
            (&local_b8,&local_1e8.super_TPZFMatrix<std::complex<double>_>,value);
  TPZMatrix<std::complex<double>_>::Storage
            (&local_150,
             *(TPZMatrix<std::complex<double>_> **)
              (this->super_TPZSTShiftOrigin<std::complex<double>_>).
              super_TPZSpectralTransform<std::complex<double>_>);
  TPZFMatrix<std::complex<double>_>::operator-=
            (&local_150.super_TPZFMatrix<std::complex<double>_>,
             &local_b8.super_TPZMatrix<std::complex<double>_>);
  TPZFMatrixRef<std::complex<double>_>::~TPZFMatrixRef
            (&local_150,&TPZFMatrixRef<std::complex<double>>::VTT);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_b8);
  TPZFMatrixRef<std::complex<double>_>::~TPZFMatrixRef
            (&local_1e8,&TPZFMatrixRef<std::complex<double>>::VTT);
  iVar3 = (**(code **)(**(long **)(this->super_TPZSTShiftOrigin<std::complex<double>_>).
                                  super_TPZSpectralTransform<std::complex<double>_> + 0x80))();
  (**(code **)((ulong)(iVar3 != 0) * 0x20 + 0xb8 +
              **(long **)(this->super_TPZSTShiftOrigin<std::complex<double>_>).
                         super_TPZSpectralTransform<std::complex<double>_>))();
  return (TPZAutoPointer<TPZMatrix<std::complex<double>_>_>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftAndInvert<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A, TPZAutoPointer<TPZMatrix<TVar>>B) const
{
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  const auto &shift = this->Shift();
  if(shiftedMat->Storage().Rows() != B->Storage().Rows()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Matrices have uncompatible storage formats.\nAborting...\n";
    DebugStop();
  }
  shiftedMat->Storage() -= B->Storage() * shift;

  if (shiftedMat->IsSymmetric()) shiftedMat->Decompose_LDLt();
  else shiftedMat->Decompose_LU();
  return shiftedMat;
}